

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<unsigned_short,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  unsigned_short uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  RLEScanState<unsigned_short> *scan_state;
  ulong uVar16;
  ulong uVar17;
  unsigned_short *data_pointer;
  ulong uVar18;
  rle_count_t *index_pointer;
  idx_t iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar32;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar44;
  undefined1 auVar45 [16];
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar76;
  int iVar78;
  undefined1 auVar77 [16];
  
  scan_state = (RLEScanState<unsigned_short> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (unsigned_short *)(pdVar2 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<unsigned_short>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar15 = _DAT_0135e330;
  auVar14 = _DAT_0135e310;
  auVar13 = _DAT_01356200;
  uVar18 = scan_count + result_offset;
  auVar23 = extraout_XMM0;
  do {
    uVar16 = uVar18 - result_offset;
    if (uVar18 < result_offset || uVar16 == 0) {
      return;
    }
    iVar3 = scan_state->entry_pos;
    iVar19 = scan_state->position_in_entry;
    uVar17 = index_pointer[iVar3] - iVar19;
    uVar1 = data_pointer[iVar3];
    if (uVar16 < uVar17) {
      lVar20 = uVar16 + (uVar16 == 0);
      lVar21 = lVar20 + -1;
      auVar42._8_4_ = (int)lVar21;
      auVar42._0_8_ = lVar21;
      auVar42._12_4_ = (int)((ulong)lVar21 >> 0x20);
      lVar21 = result_offset * 2;
      auVar42 = auVar42 ^ auVar13;
      uVar22 = 0;
      auVar52 = auVar14;
      auVar60 = auVar15;
      auVar49 = _DAT_0135e360;
      auVar51 = _DAT_0135e350;
      do {
        auVar23 = auVar52 ^ auVar13;
        iVar32 = auVar42._0_4_;
        auVar37._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
        iVar33 = auVar42._4_4_;
        auVar37._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
        iVar43 = auVar42._8_4_;
        auVar37._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
        iVar44 = auVar42._12_4_;
        auVar37._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
        auVar67._4_4_ = auVar37._0_4_;
        auVar67._0_4_ = auVar37._0_4_;
        auVar67._8_4_ = auVar37._8_4_;
        auVar67._12_4_ = auVar37._8_4_;
        auVar74 = pshuflw(in_XMM14,auVar67,0xe8);
        auVar28._0_4_ = -(uint)(auVar23._0_4_ == iVar32);
        auVar28._4_4_ = -(uint)(auVar23._4_4_ == iVar33);
        auVar28._8_4_ = -(uint)(auVar23._8_4_ == iVar43);
        auVar28._12_4_ = -(uint)(auVar23._12_4_ == iVar44);
        auVar54._4_4_ = auVar28._4_4_;
        auVar54._0_4_ = auVar28._4_4_;
        auVar54._8_4_ = auVar28._12_4_;
        auVar54._12_4_ = auVar28._12_4_;
        auVar28 = pshuflw(auVar28,auVar54,0xe8);
        auVar55._4_4_ = auVar37._4_4_;
        auVar55._0_4_ = auVar37._4_4_;
        auVar55._8_4_ = auVar37._12_4_;
        auVar55._12_4_ = auVar37._12_4_;
        auVar37 = pshuflw(auVar37,auVar55,0xe8);
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
        auVar23 = (auVar37 | auVar28 & auVar74) ^ auVar23;
        auVar23 = packssdw(auVar23,auVar23);
        if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21) = uVar1;
        }
        auVar55 = auVar54 & auVar67 | auVar55;
        auVar23 = packssdw(auVar55,auVar55);
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar74,auVar23 ^ auVar74);
        if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 2) = uVar1;
        }
        auVar23 = auVar60 ^ auVar13;
        auVar38._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
        auVar38._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
        auVar38._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
        auVar38._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
        auVar56._4_4_ = auVar38._0_4_;
        auVar56._0_4_ = auVar38._0_4_;
        auVar56._8_4_ = auVar38._8_4_;
        auVar56._12_4_ = auVar38._8_4_;
        iVar76 = -(uint)(auVar23._4_4_ == iVar33);
        iVar78 = -(uint)(auVar23._12_4_ == iVar44);
        auVar68._4_4_ = iVar76;
        auVar68._0_4_ = iVar76;
        auVar68._8_4_ = iVar78;
        auVar68._12_4_ = iVar78;
        auVar75._4_4_ = auVar38._4_4_;
        auVar75._0_4_ = auVar38._4_4_;
        auVar75._8_4_ = auVar38._12_4_;
        auVar75._12_4_ = auVar38._12_4_;
        auVar23 = auVar68 & auVar56 | auVar75;
        auVar23 = packssdw(auVar23,auVar23);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar9,auVar23 ^ auVar9);
        if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 4) = uVar1;
        }
        auVar23 = pshufhw(auVar23,auVar56,0x84);
        auVar37 = pshufhw(auVar38,auVar68,0x84);
        auVar28 = pshufhw(auVar23,auVar75,0x84);
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar29 = (auVar28 | auVar37 & auVar23) ^ auVar29;
        auVar23 = packssdw(auVar29,auVar29);
        if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 6) = uVar1;
        }
        auVar23 = auVar49 ^ auVar13;
        auVar39._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
        auVar39._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
        auVar39._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
        auVar39._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
        auVar69._4_4_ = auVar39._0_4_;
        auVar69._0_4_ = auVar39._0_4_;
        auVar69._8_4_ = auVar39._8_4_;
        auVar69._12_4_ = auVar39._8_4_;
        auVar37 = pshuflw(auVar75,auVar69,0xe8);
        auVar30._0_4_ = -(uint)(auVar23._0_4_ == iVar32);
        auVar30._4_4_ = -(uint)(auVar23._4_4_ == iVar33);
        auVar30._8_4_ = -(uint)(auVar23._8_4_ == iVar43);
        auVar30._12_4_ = -(uint)(auVar23._12_4_ == iVar44);
        auVar57._4_4_ = auVar30._4_4_;
        auVar57._0_4_ = auVar30._4_4_;
        auVar57._8_4_ = auVar30._12_4_;
        auVar57._12_4_ = auVar30._12_4_;
        auVar23 = pshuflw(auVar30,auVar57,0xe8);
        auVar58._4_4_ = auVar39._4_4_;
        auVar58._0_4_ = auVar39._4_4_;
        auVar58._8_4_ = auVar39._12_4_;
        auVar58._12_4_ = auVar39._12_4_;
        auVar28 = pshuflw(auVar39,auVar58,0xe8);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 & auVar37,(auVar28 | auVar23 & auVar37) ^ auVar10);
        if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 8) = uVar1;
        }
        auVar58 = auVar57 & auVar69 | auVar58;
        auVar28 = packssdw(auVar58,auVar58);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23,auVar28 ^ auVar11);
        if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 10) = uVar1;
        }
        auVar23 = auVar51 ^ auVar13;
        auVar40._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
        auVar40._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
        auVar40._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
        auVar40._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
        auVar59._4_4_ = auVar40._0_4_;
        auVar59._0_4_ = auVar40._0_4_;
        auVar59._8_4_ = auVar40._8_4_;
        auVar59._12_4_ = auVar40._8_4_;
        iVar32 = -(uint)(auVar23._4_4_ == iVar33);
        iVar33 = -(uint)(auVar23._12_4_ == iVar44);
        auVar70._4_4_ = iVar32;
        auVar70._0_4_ = iVar32;
        auVar70._8_4_ = iVar33;
        auVar70._12_4_ = iVar33;
        in_XMM14._4_4_ = auVar40._4_4_;
        in_XMM14._0_4_ = auVar40._4_4_;
        in_XMM14._8_4_ = auVar40._12_4_;
        in_XMM14._12_4_ = auVar40._12_4_;
        auVar23 = auVar70 & auVar59 | in_XMM14;
        auVar23 = packssdw(auVar23,auVar23);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar12,auVar23 ^ auVar12);
        if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 0xc) = uVar1;
        }
        auVar23 = pshufhw(auVar23,auVar59,0x84);
        in_XMM1 = pshufhw(auVar40,auVar70,0x84);
        in_XMM1 = in_XMM1 & auVar23;
        auVar23 = pshufhw(auVar23,in_XMM14,0x84);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = (auVar23 | in_XMM1) ^ auVar31;
        auVar23 = packssdw(auVar31,auVar31);
        if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 0xe) = uVar1;
        }
        uVar22 = uVar22 + 8;
        lVar46 = auVar52._8_8_;
        auVar52._0_8_ = auVar52._0_8_ + 8;
        auVar52._8_8_ = lVar46 + 8;
        lVar46 = auVar60._8_8_;
        auVar60._0_8_ = auVar60._0_8_ + 8;
        auVar60._8_8_ = lVar46 + 8;
        lVar46 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + 8;
        auVar49._8_8_ = lVar46 + 8;
        lVar46 = auVar51._8_8_;
        auVar51._0_8_ = auVar51._0_8_ + 8;
        auVar51._8_8_ = lVar46 + 8;
      } while ((lVar20 + 7U & 0xfffffffffffffff8) != uVar22);
      iVar19 = iVar19 + uVar16;
    }
    else {
      if (index_pointer[iVar3] != iVar19) {
        lVar21 = uVar17 - 1;
        auVar41._8_4_ = (int)lVar21;
        auVar41._0_8_ = lVar21;
        auVar41._12_4_ = (int)((ulong)lVar21 >> 0x20);
        lVar21 = result_offset * 2;
        uVar22 = 0;
        auVar45 = auVar14;
        auVar47 = auVar15;
        auVar48 = _DAT_0135e360;
        auVar50 = _DAT_0135e350;
        do {
          auVar52 = auVar41 ^ auVar13;
          auVar60 = auVar45 ^ auVar13;
          iVar32 = auVar52._0_4_;
          iVar76 = -(uint)(iVar32 < auVar60._0_4_);
          iVar33 = auVar52._4_4_;
          auVar62._4_4_ = -(uint)(iVar33 < auVar60._4_4_);
          iVar43 = auVar52._8_4_;
          iVar78 = -(uint)(iVar43 < auVar60._8_4_);
          iVar44 = auVar52._12_4_;
          auVar62._12_4_ = -(uint)(iVar44 < auVar60._12_4_);
          auVar71._4_4_ = iVar76;
          auVar71._0_4_ = iVar76;
          auVar71._8_4_ = iVar78;
          auVar71._12_4_ = iVar78;
          auVar23 = pshuflw(auVar23,auVar71,0xe8);
          auVar61._4_4_ = -(uint)(auVar60._4_4_ == iVar33);
          auVar61._12_4_ = -(uint)(auVar60._12_4_ == iVar44);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar60 = pshuflw(in_XMM1,auVar61,0xe8);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar52 = pshuflw(auVar23,auVar62,0xe8);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar24 = (auVar52 | auVar60 & auVar23) ^ auVar24;
          auVar23 = packssdw(auVar24,auVar24);
          if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21) = uVar1;
          }
          auVar62 = auVar61 & auVar71 | auVar62;
          auVar23 = packssdw(auVar62,auVar62);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 ^ auVar4,auVar23 ^ auVar4);
          if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 2) = uVar1;
          }
          auVar23 = auVar47 ^ auVar13;
          auVar34._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
          auVar34._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
          auVar34._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
          auVar34._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
          auVar63._4_4_ = auVar34._0_4_;
          auVar63._0_4_ = auVar34._0_4_;
          auVar63._8_4_ = auVar34._8_4_;
          auVar63._12_4_ = auVar34._8_4_;
          iVar76 = -(uint)(auVar23._4_4_ == iVar33);
          iVar78 = -(uint)(auVar23._12_4_ == iVar44);
          auVar72._4_4_ = iVar76;
          auVar72._0_4_ = iVar76;
          auVar72._8_4_ = iVar78;
          auVar72._12_4_ = iVar78;
          auVar77._4_4_ = auVar34._4_4_;
          auVar77._0_4_ = auVar34._4_4_;
          auVar77._8_4_ = auVar34._12_4_;
          auVar77._12_4_ = auVar34._12_4_;
          auVar23 = auVar72 & auVar63 | auVar77;
          auVar23 = packssdw(auVar23,auVar23);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 ^ auVar5,auVar23 ^ auVar5);
          if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 4) = uVar1;
          }
          auVar23 = pshufhw(auVar23,auVar63,0x84);
          auVar60 = pshufhw(auVar34,auVar72,0x84);
          auVar52 = pshufhw(auVar23,auVar77,0x84);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar52 | auVar60 & auVar23) ^ auVar25;
          auVar23 = packssdw(auVar25,auVar25);
          if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 6) = uVar1;
          }
          auVar23 = auVar48 ^ auVar13;
          auVar35._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
          auVar35._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
          auVar35._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
          auVar35._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
          auVar73._4_4_ = auVar35._0_4_;
          auVar73._0_4_ = auVar35._0_4_;
          auVar73._8_4_ = auVar35._8_4_;
          auVar73._12_4_ = auVar35._8_4_;
          auVar60 = pshuflw(auVar77,auVar73,0xe8);
          auVar26._0_4_ = -(uint)(auVar23._0_4_ == iVar32);
          auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar33);
          auVar26._8_4_ = -(uint)(auVar23._8_4_ == iVar43);
          auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar44);
          auVar64._4_4_ = auVar26._4_4_;
          auVar64._0_4_ = auVar26._4_4_;
          auVar64._8_4_ = auVar26._12_4_;
          auVar64._12_4_ = auVar26._12_4_;
          auVar23 = pshuflw(auVar26,auVar64,0xe8);
          auVar65._4_4_ = auVar35._4_4_;
          auVar65._0_4_ = auVar35._4_4_;
          auVar65._8_4_ = auVar35._12_4_;
          auVar65._12_4_ = auVar35._12_4_;
          auVar52 = pshuflw(auVar35,auVar65,0xe8);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 & auVar60,(auVar52 | auVar23 & auVar60) ^ auVar6);
          if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 8) = uVar1;
          }
          auVar65 = auVar64 & auVar73 | auVar65;
          auVar52 = packssdw(auVar65,auVar65);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23,auVar52 ^ auVar7);
          if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 10) = uVar1;
          }
          auVar23 = auVar50 ^ auVar13;
          auVar36._0_4_ = -(uint)(iVar32 < auVar23._0_4_);
          auVar36._4_4_ = -(uint)(iVar33 < auVar23._4_4_);
          auVar36._8_4_ = -(uint)(iVar43 < auVar23._8_4_);
          auVar36._12_4_ = -(uint)(iVar44 < auVar23._12_4_);
          auVar66._4_4_ = auVar36._0_4_;
          auVar66._0_4_ = auVar36._0_4_;
          auVar66._8_4_ = auVar36._8_4_;
          auVar66._12_4_ = auVar36._8_4_;
          iVar32 = -(uint)(auVar23._4_4_ == iVar33);
          iVar33 = -(uint)(auVar23._12_4_ == iVar44);
          auVar53._4_4_ = iVar32;
          auVar53._0_4_ = iVar32;
          auVar53._8_4_ = iVar33;
          auVar53._12_4_ = iVar33;
          in_XMM14._4_4_ = auVar36._4_4_;
          in_XMM14._0_4_ = auVar36._4_4_;
          in_XMM14._8_4_ = auVar36._12_4_;
          in_XMM14._12_4_ = auVar36._12_4_;
          auVar23 = auVar53 & auVar66 | in_XMM14;
          auVar23 = packssdw(auVar23,auVar23);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 ^ auVar8,auVar23 ^ auVar8);
          if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 0xc) = uVar1;
          }
          auVar23 = pshufhw(auVar23,auVar66,0x84);
          in_XMM1 = pshufhw(auVar36,auVar53,0x84);
          in_XMM1 = in_XMM1 & auVar23;
          auVar23 = pshufhw(auVar23,in_XMM14,0x84);
          auVar27._8_4_ = 0xffffffff;
          auVar27._0_8_ = 0xffffffffffffffff;
          auVar27._12_4_ = 0xffffffff;
          auVar27 = (auVar23 | in_XMM1) ^ auVar27;
          auVar23 = packssdw(auVar27,auVar27);
          if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(unsigned_short *)(pdVar2 + uVar22 * 2 + lVar21 + 0xe) = uVar1;
          }
          uVar22 = uVar22 + 8;
          lVar20 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 8;
          auVar45._8_8_ = lVar20 + 8;
          lVar20 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 8;
          auVar47._8_8_ = lVar20 + 8;
          lVar20 = auVar48._8_8_;
          auVar48._0_8_ = auVar48._0_8_ + 8;
          auVar48._8_8_ = lVar20 + 8;
          lVar20 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 8;
          auVar50._8_8_ = lVar20 + 8;
        } while ((uVar17 + 7 & 0xfffffffffffffff8) != uVar22);
      }
      result_offset = result_offset + uVar17;
      scan_state->entry_pos = iVar3 + 1;
      iVar19 = 0;
    }
    scan_state->position_in_entry = iVar19;
  } while (uVar17 <= uVar16);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}